

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O3

double __thiscall
chrono::ChFunction::Compute_max
          (ChFunction *this,double xmin,double xmax,double sampling_step,int derivate)

{
  double dVar1;
  double local_30;
  
  if (xmin <= xmax) {
    local_30 = -1e+30;
    do {
      dVar1 = xmin;
      (*this->_vptr_ChFunction[10])(this,derivate);
      if (local_30 < dVar1) {
        local_30 = xmin;
        (*this->_vptr_ChFunction[10])(this,derivate);
      }
      xmin = xmin + sampling_step;
    } while (xmin <= xmax);
  }
  else {
    local_30 = -1e+30;
  }
  return local_30;
}

Assistant:

double ChFunction::Compute_max(double xmin, double xmax, double sampling_step, int derivate) const {
    double mret = -1E30;
    for (double mx = xmin; mx <= xmax; mx += sampling_step) {
        if (this->Get_y_dN(mx, derivate) > mret)
            mret = this->Get_y_dN(mx, derivate);
    }
    return mret;
}